

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlXPathRegisterVariable(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  PyObject *pPVar3;
  undefined8 uVar4;
  PyObject *pyobj_value;
  PyObject *pyobj_ctx;
  xmlChar *ns_uri;
  xmlChar *name;
  PyObject *local_28;
  undefined *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OszO:xpathRegisterVariable",&local_20,&local_10,&local_18,&local_28);
  if (iVar1 != 0) {
    if (local_20 == &_Py_NoneStruct) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(local_20 + 0x10);
    }
    pxVar2 = libxml_xmlXPathObjectPtrConvert(local_28);
    iVar1 = xmlXPathRegisterVariableNS(uVar4,local_10,local_18,pxVar2);
    pPVar3 = libxml_intWrap(iVar1);
  }
  return pPVar3;
}

Assistant:

PyObject *
libxml_xmlXPathRegisterVariable(ATTRIBUTE_UNUSED PyObject * self,
                                PyObject * args)
{
    PyObject *py_retval;
    int c_retval = 0;
    xmlChar *name;
    xmlChar *ns_uri;
    xmlXPathContextPtr ctx;
    xmlXPathObjectPtr val;
    PyObject *pyobj_ctx;
    PyObject *pyobj_value;

    if (!PyArg_ParseTuple
        (args, (char *) "OszO:xpathRegisterVariable", &pyobj_ctx, &name,
         &ns_uri, &pyobj_value))
        return (NULL);

    ctx = (xmlXPathContextPtr) PyxmlXPathContext_Get(pyobj_ctx);
    val = libxml_xmlXPathObjectPtrConvert(pyobj_value);

    c_retval = xmlXPathRegisterVariableNS(ctx, name, ns_uri, val);
    py_retval = libxml_intWrap(c_retval);
    return (py_retval);
}